

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O1

void clusterDDel(vector<DirectDelNode,_std::allocator<DirectDelNode>_> *nodes,
                vector<DirectDelCluster,_std::allocator<DirectDelCluster>_> *clusters)

{
  pointer pcVar1;
  long lVar2;
  size_t __n;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  DirectDelNode n;
  DirectDelCluster dc;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  size_t local_e0;
  char local_d8 [16];
  vector<DirectDelCluster,std::allocator<DirectDelCluster>> *local_c8;
  pointer local_c0;
  pointer local_b8;
  double local_b0;
  char *local_a8;
  size_t local_a0;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  char local_80 [16];
  DirectDelCluster local_70;
  
  local_b8 = (nodes->super__Vector_base<DirectDelNode,_std::allocator<DirectDelNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_c0 = (nodes->super__Vector_base<DirectDelNode,_std::allocator<DirectDelNode>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_c8 = (vector<DirectDelCluster,std::allocator<DirectDelCluster>> *)clusters;
  if (local_b8 != local_c0) {
    do {
      local_e8._M_p = local_d8;
      local_f0._0_4_ = local_b8->pos;
      local_f0._4_4_ = local_b8->delLen;
      pcVar1 = (local_b8->refName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar1,pcVar1 + (local_b8->refName)._M_string_length);
      lVar2 = *(long *)local_c8;
      uVar10 = (long)*(pointer *)(local_c8 + 8) - lVar2 >> 6;
      local_a0 = local_e0;
      local_a8 = local_e8._M_p;
      local_b0 = (double)(int)local_f0._4_4_;
      uVar3 = local_f0._0_4_;
      iVar7 = local_f0._4_4_ + local_f0._0_4_;
      lVar6 = (uVar10 & 0xffffffff) - 1;
      do {
        if ((int)(uint)lVar6 < 0) {
LAB_00183261:
          local_98 = local_f0;
          local_90._M_p = local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_e8._M_p,local_e8._M_p + local_e0);
          DirectDelCluster::DirectDelCluster(&local_70,(DirectDelNode *)local_98);
          if (local_90._M_p != local_80) {
            operator_delete(local_90._M_p);
          }
          std::vector<DirectDelCluster,std::allocator<DirectDelCluster>>::
          emplace_back<DirectDelCluster&>(local_c8,&local_70);
          std::vector<DirectDelNode,_std::allocator<DirectDelNode>_>::~vector(&local_70.nodes);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.info.refName._M_dataplus._M_p != &local_70.info.refName.field_2) {
            operator_delete(local_70.info.refName._M_dataplus._M_p);
          }
          goto LAB_001832f0;
        }
        uVar8 = (ulong)((uint)lVar6 & 0x7fffffff);
        if (uVar10 <= uVar8) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8,uVar10);
        }
        __n = *(size_t *)(lVar2 + 0x10 + uVar8 * 0x40);
        if ((__n != local_a0) ||
           ((piVar9 = (int *)(uVar8 * 0x40 + lVar2), __n != 0 &&
            (iVar4 = bcmp(*(void **)(piVar9 + 2),local_a8,__n), iVar4 != 0)))) goto LAB_00183261;
        iVar5 = *piVar9;
        iVar4 = piVar9[1] + iVar5;
        if (iVar7 < iVar4) {
          iVar4 = iVar7;
        }
        if (iVar5 <= (int)uVar3) {
          iVar5 = uVar3;
        }
        lVar6 = lVar6 + -1;
      } while (((double)(iVar4 - iVar5) / (double)piVar9[1] < 0.9) ||
              ((double)(iVar4 - iVar5) / local_b0 < 0.9));
      std::vector<DirectDelNode,std::allocator<DirectDelNode>>::emplace_back<DirectDelNode&>
                ((vector<DirectDelNode,std::allocator<DirectDelNode>> *)(piVar9 + 10),
                 (DirectDelNode *)local_f0);
LAB_001832f0:
      if (local_e8._M_p != local_d8) {
        operator_delete(local_e8._M_p);
      }
      local_b8 = local_b8 + 1;
    } while (local_b8 != local_c0);
  }
  return;
}

Assistant:

void clusterDDel(const std::vector<DirectDelNode> &nodes, std::vector<DirectDelCluster> &clusters)
{
	for (DirectDelNode n : nodes)
	{
		bool found = false;
		for (int i = clusters.size() - 1; i >= 0; i--)
		{
			// diff chr
			if (clusters.at(i).info.refName != n.refName)
				break;
			if (checkRO(clusters.at(i).info, n))
			{
				// push new node
				clusters.at(i).nodes.emplace_back(n);
				found = true;
				break;
			}
		}
		// add new cluster
		if (!found)
		{
			DirectDelCluster dc(n);
			clusters.emplace_back(dc);
		}
	}
}